

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

String * __thiscall
kj::PathPtr::toString(String *__return_storage_ptr__,PathPtr *this,bool absolute)

{
  size_t sVar1;
  String *p;
  String *pSVar2;
  char *pcVar3;
  long lVar4;
  undefined7 in_register_00000011;
  char *__n;
  ulong uVar5;
  size_t size;
  char *__src;
  kj *this_00;
  long lVar6;
  String *p_1;
  char *__dest;
  Fault f;
  Fault FStack_38;
  
  uVar5 = CONCAT71(in_register_00000011,absolute) & 0xffffffff;
  sVar1 = (this->parts).size_;
  if (sVar1 == 0) {
    this_00 = (kj *)0x249d1c;
    if ((byte)uVar5 != 0) {
      this_00 = (kj *)0x254145;
    }
    str<char_const(&)[2]>
              (__return_storage_ptr__,this_00,(char (*) [2])CONCAT71(in_register_00000011,absolute))
    ;
  }
  else {
    pSVar2 = (this->parts).ptr;
    size = sVar1 - (byte)((byte)uVar5 ^ 1);
    for (lVar4 = sVar1 * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
      sVar1 = (pSVar2->content).size_;
      lVar6 = sVar1 - 1;
      if (sVar1 == 0) {
        lVar6 = 0;
      }
      size = size + lVar6;
      pSVar2 = pSVar2 + 1;
    }
    heapString(__return_storage_ptr__,size);
    __dest = (char *)(__return_storage_ptr__->content).size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->content).ptr;
    }
    pSVar2 = (this->parts).ptr;
    for (lVar4 = (this->parts).size_ * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
      if ((uVar5 & 1) != 0) {
        *__dest = '/';
        __dest = __dest + 1;
      }
      pcVar3 = (char *)(pSVar2->content).size_;
      __src = pcVar3;
      if (pcVar3 != (char *)0x0) {
        __src = (pSVar2->content).ptr;
      }
      __n = pcVar3 + -1;
      if (pcVar3 == (char *)0x0) {
        __n = (char *)0x0;
      }
      memcpy(__dest,__src,(size_t)__n);
      sVar1 = (pSVar2->content).size_;
      pcVar3 = (char *)(sVar1 - 1);
      if (sVar1 == 0) {
        pcVar3 = (char *)0x0;
      }
      __dest = __dest + (long)pcVar3;
      pSVar2 = pSVar2 + 1;
      uVar5 = 1;
    }
    sVar1 = (__return_storage_ptr__->content).size_;
    pcVar3 = (__return_storage_ptr__->content).ptr + (sVar1 - 1);
    if (sVar1 == 0) {
      pcVar3 = (char *)0x0;
    }
    if (__dest != pcVar3) {
      _::Debug::Fault::Fault
                (&FStack_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x96,FAILED,"ptr == result.end()","");
      _::Debug::Fault::fatal(&FStack_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String PathPtr::toString(bool absolute) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    return absolute ? kj::str("/") : kj::str(".");
  }

  size_t size = absolute + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = kj::heapString(size);

  char* ptr = result.begin();
  bool leadingSlash = absolute;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '/';
    leadingSlash = true;
    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  }
  KJ_ASSERT(ptr == result.end());

  return result;
}